

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ProducerIPCClientImpl::UpdateDataSource
          (ProducerIPCClientImpl *this,DataSourceDescriptor *descriptor)

{
  DataSourceDescriptor *this_00;
  Deferred<perfetto::protos::gen::UpdateDataSourceResponse> async_response;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  DeferredBase local_70;
  UpdateDataSourceRequest req;
  
  protos::gen::UpdateDataSourceRequest::UpdateDataSourceRequest(&req);
  this_00 = protos::gen::UpdateDataSourceRequest::mutable_data_source_descriptor(&req);
  protos::gen::DataSourceDescriptor::operator=(this_00,descriptor);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = 0;
  uStack_80 = 0;
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Deferred
            (&async_response,
             (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
              *)&local_98);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:73027:7)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:73027:7)>
             ::_M_manager;
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Bind
            (&async_response,
             (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
              *)&local_b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  ipc::DeferredBase::DeferredBase(&local_70,&async_response.super_DeferredBase);
  protos::gen::ProducerPortProxy::UpdateDataSource
            (&this->producer_port_,&req,(DeferredUpdateDataSourceResponse *)&local_70,-1);
  ipc::DeferredBase::~DeferredBase(&local_70);
  ipc::DeferredBase::~DeferredBase(&async_response.super_DeferredBase);
  protos::gen::UpdateDataSourceRequest::~UpdateDataSourceRequest(&req);
  return;
}

Assistant:

void ProducerIPCClientImpl::UpdateDataSource(
    const DataSourceDescriptor& descriptor) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot UpdateDataSource(), not connected to tracing service");
  }
  protos::gen::UpdateDataSourceRequest req;
  *req.mutable_data_source_descriptor() = descriptor;
  ipc::Deferred<protos::gen::UpdateDataSourceResponse> async_response;
  async_response.Bind(
      [](ipc::AsyncResult<protos::gen::UpdateDataSourceResponse> response) {
        if (!response)
          PERFETTO_DLOG("UpdateDataSource() failed: connection reset");
      });
  producer_port_.UpdateDataSource(req, std::move(async_response));
}